

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_region_transaction_commit_riscv64(MemoryRegion_conflict *mr)

{
  MemoryListener *local_28;
  MemoryListener *_listener_1;
  MemoryListener *_listener;
  AddressSpace *as;
  MemoryRegion_conflict *mr_local;
  
  if ((mr->uc->memory_region_update_pending & 1U) != 0) {
    flatviews_reset((uc_struct_conflict13 *)mr->uc);
    for (_listener_1 = (mr->uc->memory_listeners).tqh_first; _listener_1 != (MemoryListener *)0x0;
        _listener_1 = (_listener_1->link).tqe_next) {
      if (_listener_1->begin != (_func_void_MemoryListener_ptr *)0x0) {
        (*_listener_1->begin)(_listener_1);
      }
    }
    for (_listener = (MemoryListener *)(mr->uc->address_spaces).tqh_first;
        _listener != (MemoryListener *)0x0; _listener = (MemoryListener *)_listener->region_nop) {
      address_space_set_flatview((AddressSpace *)_listener);
    }
    mr->uc->memory_region_update_pending = false;
    for (local_28 = (mr->uc->memory_listeners).tqh_first; local_28 != (MemoryListener *)0x0;
        local_28 = (local_28->link).tqe_next) {
      if (local_28->commit != (_func_void_MemoryListener_ptr *)0x0) {
        (*local_28->commit)(local_28);
      }
    }
  }
  return;
}

Assistant:

void memory_region_transaction_commit(MemoryRegion *mr)
{
    AddressSpace *as;

    if (mr->uc->memory_region_update_pending) {
        flatviews_reset(mr->uc);

        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, begin, Forward);

        QTAILQ_FOREACH(as, &mr->uc->address_spaces, address_spaces_link) {
            address_space_set_flatview(as);
        }
        mr->uc->memory_region_update_pending = false;
        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, commit, Forward);
    }
}